

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

logical pnga_comp_patch(Integer andim,Integer *alo,Integer *ahi,Integer bndim,Integer *blo,
                       Integer *bhi)

{
  Integer IVar1;
  long lVar2;
  
  lVar2 = bndim;
  if (bndim < andim) {
    do {
      if (alo[lVar2] != ahi[lVar2]) {
        return 0;
      }
      lVar2 = lVar2 + 1;
      IVar1 = bndim;
    } while (andim != lVar2);
  }
  else {
    IVar1 = andim;
    lVar2 = andim;
    if (andim < bndim) {
      do {
        if (blo[lVar2] != bhi[lVar2]) {
          return 0;
        }
        lVar2 = lVar2 + 1;
      } while (bndim != lVar2);
    }
  }
  if (0 < IVar1) {
    lVar2 = 0;
    do {
      if ((alo[lVar2] != blo[lVar2]) || (ahi[lVar2] != bhi[lVar2])) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (IVar1 != lVar2);
  }
  return 1;
}

Assistant:

logical pnga_comp_patch(Integer andim, Integer *alo, Integer *ahi,
                          Integer bndim, Integer *blo, Integer *bhi)
{
    Integer i;
    Integer ndim;
    
    if(andim > bndim) {
        ndim = bndim;
        for(i=ndim; i<andim; i++)
            if(alo[i] != ahi[i]) return FALSE;
    }
    else if(andim < bndim) {
        ndim = andim;
        for(i=ndim; i<bndim; i++)
            if(blo[i] != bhi[i]) return FALSE;
    }
    else ndim = andim;
    
    for(i=0; i<ndim; i++)
        if((alo[i] != blo[i]) || (ahi[i] != bhi[i])) return FALSE;

    return TRUE; 
}